

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
adios2::helper::Comm::GetGathervDisplacements
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          size_t *counts,size_t countsSize)

{
  pointer puVar1;
  unsigned_long uVar2;
  long lVar3;
  allocator_type local_19;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,countsSize,&local_19);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar1 = 0;
  if (1 < countsSize) {
    uVar2 = *puVar1;
    lVar3 = 0;
    do {
      uVar2 = uVar2 + counts[lVar3];
      puVar1[lVar3 + 1] = uVar2;
      lVar3 = lVar3 + 1;
    } while (countsSize - 1 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> Comm::GetGathervDisplacements(const size_t *counts, const size_t countsSize)
{
    std::vector<size_t> displacements(countsSize);
    displacements[0] = 0;

    for (size_t i = 1; i < countsSize; ++i)
    {
        displacements[i] = displacements[i - 1] + counts[i - 1];
    }
    return displacements;
}